

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

void __thiscall
google::protobuf::FileDescriptorProto::FileDescriptorProto(FileDescriptorProto *this)

{
  FileDescriptorProto *pFVar1;
  FileDescriptorProto *this_local;
  
  Message::Message(&this->super_Message);
  (this->super_Message).super_MessageLite._vptr_MessageLite =
       (_func_int **)&PTR__FileDescriptorProto_00d601a0;
  internal::InternalMetadataWithArena::InternalMetadataWithArena
            (&this->_internal_metadata_,(Arena *)0x0);
  memset(&this->_has_bits_,0,4);
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::RepeatedPtrField(&this->dependency_);
  RepeatedPtrField<google::protobuf::DescriptorProto>::RepeatedPtrField(&this->message_type_);
  RepeatedPtrField<google::protobuf::EnumDescriptorProto>::RepeatedPtrField(&this->enum_type_);
  RepeatedPtrField<google::protobuf::ServiceDescriptorProto>::RepeatedPtrField(&this->service_);
  RepeatedPtrField<google::protobuf::FieldDescriptorProto>::RepeatedPtrField(&this->extension_);
  RepeatedField<int>::RepeatedField(&this->public_dependency_);
  RepeatedField<int>::RepeatedField(&this->weak_dependency_);
  pFVar1 = internal_default_instance();
  if (this != pFVar1) {
    protobuf_google_2fprotobuf_2fdescriptor_2eproto::InitDefaults();
  }
  SharedCtor(this);
  return;
}

Assistant:

FileDescriptorProto::FileDescriptorProto()
  : ::google::protobuf::Message(), _internal_metadata_(NULL) {
  if (GOOGLE_PREDICT_TRUE(this != internal_default_instance())) {
    protobuf_google_2fprotobuf_2fdescriptor_2eproto::InitDefaults();
  }
  SharedCtor();
  // @@protoc_insertion_point(constructor:google.protobuf.FileDescriptorProto)
}